

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::__fastunpack16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    uVar1 = in[lVar2];
    out[lVar2 * 2] = uVar1 & 0xffff;
    out[lVar2 * 2 + 1] = uVar1 >> 0x10;
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 0x10);
  return;
}

Assistant:

void __fastunpack16(const uint32_t *__restrict in, uint32_t *__restrict out) {
	for (uint32_t outer = 0; outer < 16; ++outer) {
		for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 16)
			*(out++) = ((*in) >> inwordpointer) % (1U << 16);
		++in;
	}
}